

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

void __thiscall duckdb::DetachInfo::Serialize(DetachInfo *this,Serializer *serializer)

{
  ParseInfo::Serialize(&this->super_ParseInfo,serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>(serializer,200,"name",&this->name);
  Serializer::WriteProperty<duckdb::OnEntryNotFound>
            (serializer,0xc9,"if_not_found",&this->if_not_found);
  return;
}

Assistant:

void DetachInfo::Serialize(Serializer &serializer) const {
	ParseInfo::Serialize(serializer);
	serializer.WritePropertyWithDefault<string>(200, "name", name);
	serializer.WriteProperty<OnEntryNotFound>(201, "if_not_found", if_not_found);
}